

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O1

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_one_line_comment
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  input_stream_t<cfgfile::qstring_trait_t> *piVar1;
  char cVar2;
  char_t cVar3;
  
  piVar1 = this->m_stream;
  if (((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) || (cVar2 = QTextStream::atEnd(), cVar2 == '\0'))
      || (piVar1->m_buf_pos != (piVar1->m_buf).d.size)) &&
     (cVar3 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream),
     cVar3.ucs != const_t<cfgfile::qstring_trait_t>::c_carriage_return)) {
    do {
      if (cVar3.ucs == const_t<cfgfile::qstring_trait_t>::c_line_feed) {
        return;
      }
      piVar1 = this->m_stream;
      if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) && (cVar2 = QTextStream::atEnd(), cVar2 != '\0')
          ) && (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) {
        return;
      }
      cVar3 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
    } while (cVar3.ucs != const_t<cfgfile::qstring_trait_t>::c_carriage_return);
  }
  return;
}

Assistant:

void skip_one_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			while( ch != const_t< Trait >::c_carriage_return &&
				ch != const_t< Trait >::c_line_feed &&
				!m_stream.at_end() )
					ch = m_stream.get();
		}
	}